

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int mtree_bid(archive_read *a,int best_bid)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = (int *)__archive_read_ahead(a,6,(ssize_t *)0x0);
  if (piVar2 == (int *)0x0) {
    iVar1 = -1;
  }
  else {
    if ((short)piVar2[1] != 0x6565 || *piVar2 != 0x72746d23) {
      iVar1 = detect_form(a,(int *)0x0);
      return iVar1;
    }
    iVar1 = 0x30;
  }
  return iVar1;
}

Assistant:

static int
mtree_bid(struct archive_read *a, int best_bid)
{
	const char *signature = "#mtree";
	const char *p;

	(void)best_bid; /* UNUSED */

	/* Now let's look at the actual header and see if it matches. */
	p = __archive_read_ahead(a, strlen(signature), NULL);
	if (p == NULL)
		return (-1);

	if (memcmp(p, signature, strlen(signature)) == 0)
		return (8 * (int)strlen(signature));

	/*
	 * There is not a mtree signature. Let's try to detect mtree format.
	 */
	return (detect_form(a, NULL));
}